

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O1

BUFFER_HANDLE mqtt_codec_connect(MQTT_CLIENT_OPTIONS *mqttOptions,STRING_HANDLE trace_log)

{
  byte bVar1;
  int iVar2;
  BUFFER_HANDLE handle;
  STRING_HANDLE handle_00;
  uchar *puVar3;
  size_t __n;
  ulong __n_00;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  ushort *puVar7;
  ushort *puVar8;
  STRING_HANDLE local_60;
  ulong local_58;
  ulong local_50;
  ulong local_38;
  
  if ((mqttOptions == (MQTT_CLIENT_OPTIONS *)0x0) ||
     (handle = BUFFER_new(), handle == (BUFFER_HANDLE)0x0)) {
    return (BUFFER_HANDLE)0x0;
  }
  if (trace_log == (STRING_HANDLE)0x0) {
    handle_00 = (STRING_HANDLE)0x0;
  }
  else {
    handle_00 = STRING_new();
  }
  iVar2 = BUFFER_enlarge(handle,10);
  if ((iVar2 != 0) || (puVar3 = BUFFER_u_char(handle), puVar3 == (uchar *)0x0)) {
    BUFFER_delete(handle);
    return (BUFFER_HANDLE)0x0;
  }
  if (handle_00 != (STRING_HANDLE)0x0) {
    STRING_sprintf(handle_00," | VER: %d | KEEPALIVE: %d | FLAGS:",4,
                   (ulong)mqttOptions->keepAliveInterval);
  }
  puVar3[0] = '\0';
  puVar3[1] = '\x04';
  puVar3[2] = 'M';
  puVar3[3] = 'Q';
  puVar3[4] = 'T';
  puVar3[5] = 'T';
  puVar3[6] = '\x04';
  puVar3[7] = '\0';
  *(uint16_t *)(puVar3 + 8) =
       mqttOptions->keepAliveInterval << 8 | mqttOptions->keepAliveInterval >> 8;
  if (mqttOptions->clientId == (char *)0x0) {
    __n = 0;
    lVar6 = 0;
  }
  else {
    __n = strlen(mqttOptions->clientId);
    lVar6 = 2;
  }
  if (mqttOptions->username == (char *)0x0) {
    __n_00 = 0;
  }
  else {
    lVar6 = lVar6 + 2;
    __n_00 = strlen(mqttOptions->username);
  }
  if (mqttOptions->password == (char *)0x0) {
    local_38 = 0;
  }
  else {
    lVar6 = lVar6 + 2;
    local_38 = strlen(mqttOptions->password);
  }
  if (mqttOptions->willMessage == (char *)0x0) {
    local_50 = 0;
  }
  else {
    lVar6 = lVar6 + 2;
    local_50 = strlen(mqttOptions->willMessage);
  }
  if (mqttOptions->willTopic == (char *)0x0) {
    local_58 = 0;
  }
  else {
    lVar6 = lVar6 + 2;
    local_58 = strlen(mqttOptions->willTopic);
  }
  sVar4 = BUFFER_length(handle);
  if ((((__n < 0x10000) && (__n_00 != 0 || local_38 == 0)) && (local_50 == 0 || local_58 != 0)) &&
     ((local_58 == 0 || local_50 != 0 &&
      (iVar2 = BUFFER_enlarge(handle,lVar6 + local_58 + local_38 + local_50 + __n_00 + __n),
      iVar2 == 0)))) {
    puVar3 = BUFFER_u_char(handle);
    pcVar5 = mqttOptions->clientId;
    *(ushort *)(puVar3 + sVar4) = (ushort)__n << 8 | (ushort)__n >> 8;
    memcpy(puVar3 + sVar4 + 2,pcVar5,__n);
    if ((local_38 < 0x10000 && __n_00 < 0x10000) && (local_58 < 0x10000 && local_50 < 0x10000)) {
      if (handle_00 == (STRING_HANDLE)0x0) {
        local_60 = (STRING_HANDLE)0x0;
      }
      else {
        local_60 = STRING_new();
      }
      puVar7 = (ushort *)(puVar3 + __n + sVar4 + 2);
      if (local_50 != 0 && local_58 != 0) {
        if (handle_00 != (STRING_HANDLE)0x0) {
          STRING_sprintf(local_60," | WILL_TOPIC: %s",mqttOptions->willTopic);
        }
        puVar3[7] = puVar3[7] | 4;
        pcVar5 = mqttOptions->willTopic;
        *puVar7 = (ushort)local_58 << 8 | (ushort)local_58 >> 8;
        memcpy(puVar3 + __n + sVar4 + 4,pcVar5,local_58);
        bVar1 = (char)mqttOptions->qualityOfServiceValue << 3 | puVar3[7];
        puVar8 = (ushort *)((long)puVar7 + local_58 + 2);
        puVar3[7] = bVar1;
        if (mqttOptions->messageRetain == true) {
          puVar3[7] = bVar1 | 0x20;
        }
        pcVar5 = mqttOptions->willMessage;
        *puVar8 = (ushort)local_50 << 8 | (ushort)local_50 >> 8;
        memcpy((void *)((long)puVar7 + local_58 + 4),pcVar5,local_50);
        puVar7 = (ushort *)((long)puVar8 + local_50 + 2);
      }
      if (__n_00 != 0) {
        puVar3[7] = puVar3[7] | 0x80;
        pcVar5 = mqttOptions->username;
        *puVar7 = (ushort)__n_00 << 8 | (ushort)__n_00 >> 8;
        memcpy(puVar7 + 1,pcVar5,__n_00);
        puVar7 = (ushort *)((long)puVar7 + __n_00 + 2);
        if (handle_00 != (STRING_HANDLE)0x0) {
          STRING_sprintf(local_60," | USERNAME: %s",mqttOptions->username);
        }
      }
      if (local_38 == 0) {
LAB_00114ad9:
        if (handle_00 != (STRING_HANDLE)0x0) {
          pcVar5 = "0";
          if (mqttOptions->useCleanSession != false) {
            pcVar5 = "1";
          }
          STRING_sprintf(local_60," | CLEAN: %s",pcVar5);
        }
      }
      else {
        puVar3[7] = puVar3[7] | 0x40;
        pcVar5 = mqttOptions->password;
        *puVar7 = (ushort)local_38 << 8 | (ushort)local_38 >> 8;
        memcpy(puVar7 + 1,pcVar5,local_38);
        if (handle_00 != (STRING_HANDLE)0x0) {
          STRING_sprintf(local_60," | PWD: XXXX");
          goto LAB_00114ad9;
        }
      }
      if (mqttOptions->useCleanSession == true) {
        puVar3[7] = puVar3[7] | 2;
      }
      if (handle_00 != (STRING_HANDLE)0x0) {
        STRING_sprintf(handle_00," %lu",(ulong)puVar3[7]);
        STRING_concat_with_STRING(handle_00,local_60);
        STRING_delete(local_60);
      }
      if (trace_log != (STRING_HANDLE)0x0) {
        STRING_copy(trace_log,"CONNECT");
      }
      iVar2 = constructFixedHeader(handle,CONNECT_TYPE,'\0');
      if (iVar2 == 0) {
        if (trace_log != (STRING_HANDLE)0x0) {
          STRING_concat_with_STRING(trace_log,handle_00);
        }
        goto LAB_00114b78;
      }
    }
  }
  BUFFER_delete(handle);
  handle = (BUFFER_HANDLE)0x0;
LAB_00114b78:
  if (handle_00 != (STRING_HANDLE)0x0) {
    STRING_delete(handle_00);
    return handle;
  }
  return handle;
}

Assistant:

BUFFER_HANDLE mqtt_codec_connect(const MQTT_CLIENT_OPTIONS* mqttOptions, STRING_HANDLE trace_log)
{
    BUFFER_HANDLE result;
    /* Codes_SRS_MQTT_CODEC_07_008: [If the parameters mqttOptions is NULL then mqtt_codec_connect shall return a null value.] */
    if (mqttOptions == NULL)
    {
        result = NULL;
    }
    else
    {
        /* Codes_SRS_MQTT_CODEC_07_009: [mqtt_codec_connect shall construct a BUFFER_HANDLE that represents a MQTT CONNECT packet.] */
        result = BUFFER_new();
        if (result != NULL)
        {
            STRING_HANDLE varible_header_log = NULL;
            if (trace_log != NULL)
            {
                varible_header_log = STRING_new();
            }
            // Add Variable Header Information
            if (constructConnectVariableHeader(result, mqttOptions, varible_header_log) != 0)
            {
                /* Codes_SRS_MQTT_CODEC_07_010: [If any error is encountered then mqtt_codec_connect shall return NULL.] */
                BUFFER_delete(result);
                result = NULL;
            }
            else
            {
                if (constructConnPayload(result, mqttOptions, varible_header_log) != 0)
                {
                    /* Codes_SRS_MQTT_CODEC_07_010: [If any error is encountered then mqtt_codec_connect shall return NULL.] */
                    BUFFER_delete(result);
                    result = NULL;
                }
                else
                {
                    if (trace_log != NULL)
                    {
                        (void)STRING_copy(trace_log, "CONNECT");
                    }
                    if (constructFixedHeader(result, CONNECT_TYPE, 0) != 0)
                    {
                        /* Codes_SRS_MQTT_CODEC_07_010: [If any error is encountered then mqtt_codec_connect shall return NULL.] */
                        BUFFER_delete(result);
                        result = NULL;
                    }
                    else
                    {
                        if (trace_log != NULL)
                        {
                            (void)STRING_concat_with_STRING(trace_log, varible_header_log);
                        }
                    }
                }
                if (varible_header_log != NULL)
                {
                    STRING_delete(varible_header_log);
                }
            }
        }
    }
    return result;
}